

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int axset_compare(void *a,void *b)

{
  int local_2c;
  int c;
  axset *p2;
  axset *p1;
  void *b_local;
  void *a_local;
  
  local_2c = *(int *)((long)b + 0xc) - *(int *)((long)a + 0xc);
  if (local_2c == 0) {
    local_2c = *(int *)((long)a + 0x10) - *(int *)((long)b + 0x10);
  }
  if ((local_2c == 0) && (a != b)) {
    __assert_fail("c!=0 || p1==p2",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwenn[P]lemon-rs/third_party/lemon/lemon.c"
                  ,0x10fc,"int axset_compare(const void *, const void *)");
  }
  return local_2c;
}

Assistant:

static int axset_compare(const void *a, const void *b){
  struct axset *p1 = (struct axset*)a;
  struct axset *p2 = (struct axset*)b;
  int c;
  c = p2->nAction - p1->nAction;
  if( c==0 ){
    c = p1->iOrder - p2->iOrder;
  }
  assert( c!=0 || p1==p2 );
  return c;
}